

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_etc.cpp
# Opt level: O1

bool basisu::unpack_etc1(etc_block *block,color_rgba *pDst,bool preserve_alpha)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  ushort packed_color5;
  uint uVar7;
  color_rgba subblock_colors1 [4];
  color_rgba subblock_colors0 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 aaStack_58 [4];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_48 [5];
  undefined4 local_34;
  
  bVar1 = (block->field_0).m_bytes[3];
  uVar7 = bVar1 >> 2 & 7;
  uVar5 = (uint)(block->field_0).m_bytes[0];
  if ((bVar1 & 2) == 0) {
    etc_block::get_abs_subblock_colors
              ((color_rgba *)&local_48[0].field_1,
               (ushort)((uVar5 & 0xf0) << 4) |
               (ushort)((block->field_0).m_bytes[2] >> 4) | (block->field_0).m_bytes[1] & 0xfff0,
               (uint)(bVar1 >> 5));
    etc_block::get_abs_subblock_colors
              ((color_rgba *)&aaStack_58[0].field_1,
               ((block->field_0).m_bytes[0] & 0xf) << 8 |
               (ushort)(byte)((block->field_0).m_bytes[1] << 4) | (block->field_0).m_bytes[2] & 0xf,
               uVar7);
  }
  else {
    local_34 = (undefined4)CONCAT71(in_register_00000011,preserve_alpha);
    bVar2 = (block->field_0).m_bytes[1];
    bVar3 = (block->field_0).m_bytes[2];
    packed_color5 = (ushort)((uVar5 & 0xf8) << 7) | (ushort)(bVar3 >> 3) + (bVar2 & 0xfff8) * 4;
    etc_block::get_diff_subblock_colors
              ((color_rgba *)&local_48[0].field_1,packed_color5,(uint)(bVar1 >> 5));
    preserve_alpha = SUB41(local_34,0);
    bVar4 = etc_block::get_diff_subblock_colors
                      ((color_rgba *)&aaStack_58[0].field_1,packed_color5,
                       (ushort)((uVar5 & 7) << 6) | (bVar3 & 7) + (bVar2 & 7) * 8,uVar7);
    if (!bVar4) {
      return false;
    }
  }
  uVar5 = 0;
  if (preserve_alpha == false) {
    if ((bVar1 & 1) == 0) {
      do {
        *pDst = (color_rgba)
                local_48[*(byte *)((long)&g_etc1_to_selector_index +
                                  (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar5 & 0x1f) & 1)
                                                != 0) +
                                         ((block->field_0).m_bytes[5] >> ((byte)uVar5 & 0x1f) & 1) *
                                         2))];
        uVar7 = uVar5 + 4;
        (&pDst->field_0)[1] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) !=
                                             0) +
                                      ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2)
                               )];
        (&pDst->field_0)[2] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar5 & 0x1f) & 1) != 0) +
                              ((block->field_0).m_bytes[4] >> ((byte)uVar5 & 0x1f) & 1) * 2))];
        (&pDst->field_0)[3] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) != 0) +
                              ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2))];
        pDst = (color_rgba *)(&pDst->field_0 + 4);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 4);
    }
    else {
      do {
        *pDst = (color_rgba)
                local_48[*(byte *)((long)&g_etc1_to_selector_index +
                                  (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar5 & 0x1f) & 1)
                                                != 0) +
                                         ((block->field_0).m_bytes[5] >> ((byte)uVar5 & 0x1f) & 1) *
                                         2))];
        uVar7 = uVar5 + 4;
        (&pDst->field_0)[1] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) !=
                                             0) +
                                      ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2)
                               )];
        (&pDst->field_0)[2] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar5 & 0x1f) & 1) !=
                                             0) +
                                      ((block->field_0).m_bytes[4] >> ((byte)uVar5 & 0x1f) & 1) * 2)
                               )];
        (&pDst->field_0)[3] =
             local_48[*(byte *)((long)&g_etc1_to_selector_index +
                               (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) !=
                                             0) +
                                      ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2)
                               )];
        pDst = (color_rgba *)(&pDst->field_0 + 4);
        uVar5 = uVar5 + 1;
      } while (uVar7 == 4);
      uVar5 = 2;
      do {
        *pDst = (color_rgba)
                aaStack_58
                [*(byte *)((long)&g_etc1_to_selector_index +
                          (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar5 & 0x1f) & 1) != 0) +
                                 ((block->field_0).m_bytes[5] >> ((byte)uVar5 & 0x1f) & 1) * 2))];
        uVar7 = uVar5 + 4;
        (&pDst->field_0)[1] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) != 0) +
                              ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2))];
        (&pDst->field_0)[2] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar5 & 0x1f) & 1) != 0) +
                              ((block->field_0).m_bytes[4] >> ((byte)uVar5 & 0x1f) & 1) * 2))];
        (&pDst->field_0)[3] =
             aaStack_58
             [*(byte *)((long)&g_etc1_to_selector_index +
                       (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) != 0) +
                              ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2))];
        pDst = (color_rgba *)(&pDst->field_0 + 4);
        uVar5 = uVar5 + 1;
      } while (uVar5 != 4);
    }
  }
  else if ((bVar1 & 1) == 0) {
    do {
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar5 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar5 & 0x1f) & 1) * 2))
      ;
      (pDst->field_0).m_comps[0] = local_48[0].m_comps[uVar6 * 4];
      (pDst->field_0).m_comps[1] = local_48[0].m_comps[uVar6 * 4 + 1];
      (pDst->field_0).m_comps[2] = local_48[0].m_comps[uVar6 * 4 + 2];
      uVar7 = uVar5 + 4;
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      pDst[1].field_0.m_comps[0] = local_48[0].m_comps[uVar6 * 4];
      pDst[1].field_0.m_comps[1] = local_48[0].m_comps[uVar6 * 4 + 1];
      pDst[1].field_0.m_comps[2] = local_48[0].m_comps[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar5 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar5 & 0x1f) & 1) * 2))
      ;
      pDst[2].field_0.m_comps[0] = aaStack_58[0].m_comps[uVar6 * 4];
      pDst[2].field_0.m_comps[1] = aaStack_58[0].m_comps[uVar6 * 4 + 1];
      pDst[2].field_0.m_comps[2] = aaStack_58[0].m_comps[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      pDst[3].field_0.m_comps[0] = aaStack_58[0].m_comps[uVar6 * 4];
      pDst[3].field_0.m_comps[1] = aaStack_58[0].m_comps[uVar6 * 4 + 1];
      pDst[3].field_0.m_comps[2] = aaStack_58[0].m_comps[uVar6 * 4 + 2];
      pDst = pDst + 4;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
  }
  else {
    do {
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar5 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar5 & 0x1f) & 1) * 2))
      ;
      (pDst->field_0).m_comps[0] = local_48[0].m_comps[uVar6 * 4];
      (pDst->field_0).m_comps[1] = local_48[0].m_comps[uVar6 * 4 + 1];
      (pDst->field_0).m_comps[2] = local_48[0].m_comps[uVar6 * 4 + 2];
      uVar7 = uVar5 + 4;
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      pDst[1].field_0.m_comps[0] = local_48[0].m_comps[uVar6 * 4];
      pDst[1].field_0.m_comps[1] = local_48[0].m_comps[uVar6 * 4 + 1];
      pDst[1].field_0.m_comps[2] = local_48[0].m_comps[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar5 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar5 & 0x1f) & 1) * 2))
      ;
      pDst[2].field_0.m_comps[0] = local_48[0].m_comps[uVar6 * 4];
      pDst[2].field_0.m_comps[1] = local_48[0].m_comps[uVar6 * 4 + 1];
      pDst[2].field_0.m_comps[2] = local_48[0].m_comps[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      pDst[3].field_0.m_comps[0] = local_48[0].m_comps[uVar6 * 4];
      pDst[3].field_0.m_comps[1] = local_48[0].m_comps[uVar6 * 4 + 1];
      pDst[3].field_0.m_comps[2] = local_48[0].m_comps[uVar6 * 4 + 2];
      pDst = pDst + 4;
      uVar5 = uVar5 + 1;
    } while (uVar7 == 4);
    uVar5 = 2;
    do {
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar5 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar5 & 0x1f) & 1) * 2))
      ;
      (pDst->field_0).m_comps[0] = aaStack_58[0].m_comps[uVar6 * 4];
      (pDst->field_0).m_comps[1] = aaStack_58[0].m_comps[uVar6 * 4 + 1];
      (pDst->field_0).m_comps[2] = aaStack_58[0].m_comps[uVar6 * 4 + 2];
      uVar7 = uVar5 + 4;
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[7] >> (uVar7 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[5] >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      pDst[1].field_0.m_comps[0] = aaStack_58[0].m_comps[uVar6 * 4];
      pDst[1].field_0.m_comps[1] = aaStack_58[0].m_comps[uVar6 * 4 + 1];
      pDst[1].field_0.m_comps[2] = aaStack_58[0].m_comps[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar5 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar5 & 0x1f) & 1) * 2))
      ;
      pDst[2].field_0.m_comps[0] = aaStack_58[0].m_comps[uVar6 * 4];
      pDst[2].field_0.m_comps[1] = aaStack_58[0].m_comps[uVar6 * 4 + 1];
      pDst[2].field_0.m_comps[2] = aaStack_58[0].m_comps[uVar6 * 4 + 2];
      uVar6 = (ulong)*(byte *)((long)&g_etc1_to_selector_index +
                              (ulong)((uint)(((block->field_0).m_bytes[6] >> (uVar7 & 0x1f) & 1) !=
                                            0) +
                                     ((block->field_0).m_bytes[4] >> ((byte)uVar7 & 0x1f) & 1) * 2))
      ;
      pDst[3].field_0.m_comps[0] = aaStack_58[0].m_comps[uVar6 * 4];
      pDst[3].field_0.m_comps[1] = aaStack_58[0].m_comps[uVar6 * 4 + 1];
      pDst[3].field_0.m_comps[2] = aaStack_58[0].m_comps[uVar6 * 4 + 2];
      pDst = pDst + 4;
      uVar5 = uVar5 + 1;
    } while (uVar5 != 4);
  }
  return true;
}

Assistant:

bool unpack_etc1(const etc_block& block, color_rgba *pDst, bool preserve_alpha)
	{
		const bool diff_flag = block.get_diff_bit();
		const bool flip_flag = block.get_flip_bit();
		const uint32_t table_index0 = block.get_inten_table(0);
		const uint32_t table_index1 = block.get_inten_table(1);

		color_rgba subblock_colors0[4];
		color_rgba subblock_colors1[4];

		if (diff_flag)
		{
			const uint16_t base_color5 = block.get_base5_color();
			const uint16_t delta_color3 = block.get_delta3_color();
			etc_block::get_diff_subblock_colors(subblock_colors0, base_color5, table_index0);

			if (!etc_block::get_diff_subblock_colors(subblock_colors1, base_color5, delta_color3, table_index1))
				return false;
		}
		else
		{
			const uint16_t base_color4_0 = block.get_base4_color(0);
			etc_block::get_abs_subblock_colors(subblock_colors0, base_color4_0, table_index0);

			const uint16_t base_color4_1 = block.get_base4_color(1);
			etc_block::get_abs_subblock_colors(subblock_colors1, base_color4_1, table_index1);
		}

		if (preserve_alpha)
		{
			if (flip_flag)
			{
				for (uint32_t y = 0; y < 2; y++)
				{
					pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors0[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors0[block.get_selector(3, y)]);
					pDst += 4;
				}

				for (uint32_t y = 2; y < 4; y++)
				{
					pDst[0].set_rgb(subblock_colors1[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors1[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
					pDst += 4;
				}
			}
			else
			{
				for (uint32_t y = 0; y < 4; y++)
				{
					pDst[0].set_rgb(subblock_colors0[block.get_selector(0, y)]);
					pDst[1].set_rgb(subblock_colors0[block.get_selector(1, y)]);
					pDst[2].set_rgb(subblock_colors1[block.get_selector(2, y)]);
					pDst[3].set_rgb(subblock_colors1[block.get_selector(3, y)]);
					pDst += 4;
				}
			}
		}
		else
		{
			if (flip_flag)
			{
				// 0000
				// 0000
				// 1111
				// 1111
				for (uint32_t y = 0; y < 2; y++)
				{
					pDst[0] = subblock_colors0[block.get_selector(0, y)];
					pDst[1] = subblock_colors0[block.get_selector(1, y)];
					pDst[2] = subblock_colors0[block.get_selector(2, y)];
					pDst[3] = subblock_colors0[block.get_selector(3, y)];
					pDst += 4;
				}

				for (uint32_t y = 2; y < 4; y++)
				{
					pDst[0] = subblock_colors1[block.get_selector(0, y)];
					pDst[1] = subblock_colors1[block.get_selector(1, y)];
					pDst[2] = subblock_colors1[block.get_selector(2, y)];
					pDst[3] = subblock_colors1[block.get_selector(3, y)];
					pDst += 4;
				}
			}
			else
			{
				// 0011
				// 0011
				// 0011
				// 0011
				for (uint32_t y = 0; y < 4; y++)
				{
					pDst[0] = subblock_colors0[block.get_selector(0, y)];
					pDst[1] = subblock_colors0[block.get_selector(1, y)];
					pDst[2] = subblock_colors1[block.get_selector(2, y)];
					pDst[3] = subblock_colors1[block.get_selector(3, y)];
					pDst += 4;
				}
			}
		}

		return true;
	}